

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O0

ssize_t ngx_parse_size(ngx_str_t *line)

{
  ssize_t sVar1;
  long local_40;
  ssize_t max;
  ssize_t scale;
  ssize_t size;
  size_t len;
  u_char unit;
  ngx_str_t *line_local;
  
  size = line->len;
  if (size == 0) {
    line_local = (ngx_str_t *)0xffffffffffffffff;
  }
  else {
    switch(line->data[size - 1]) {
    case 'K':
    case 'k':
      size = size - 1;
      local_40 = 0x1fffffffffffff;
      max = 0x400;
      break;
    default:
      local_40 = 0x7fffffffffffffff;
      max = 1;
      break;
    case 'M':
    case 'm':
      size = size - 1;
      local_40 = 0x7ffffffffff;
      max = 0x100000;
    }
    sVar1 = ngx_atosz(line->data,size);
    if ((sVar1 == -1) || (local_40 < sVar1)) {
      line_local = (ngx_str_t *)0xffffffffffffffff;
    }
    else {
      line_local = (ngx_str_t *)(max * sVar1);
    }
  }
  return (ssize_t)line_local;
}

Assistant:

ssize_t
ngx_parse_size(ngx_str_t *line)
{
    u_char   unit;
    size_t   len;
    ssize_t  size, scale, max;

    len = line->len;

    if (len == 0) {
        return NGX_ERROR;
    }

    unit = line->data[len - 1];

    switch (unit) {
    case 'K':
    case 'k':
        len--;
        max = NGX_MAX_SIZE_T_VALUE / 1024;
        scale = 1024;
        break;

    case 'M':
    case 'm':
        len--;
        max = NGX_MAX_SIZE_T_VALUE / (1024 * 1024);
        scale = 1024 * 1024;
        break;

    default:
        max = NGX_MAX_SIZE_T_VALUE;
        scale = 1;
    }

    size = ngx_atosz(line->data, len);
    if (size == NGX_ERROR || size > max) {
        return NGX_ERROR;
    }

    size *= scale;

    return size;
}